

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::
initialize_with_string_view
          (basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          string_view_type sv,error_code *ec)

{
  bool bVar1;
  basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this_00;
  const_pointer pvVar2;
  basic_json_parser<char,_std::allocator<char>_> *this_01;
  error_code *this_02;
  size_type sVar3;
  undefined8 *in_RCX;
  long in_RDI;
  type tVar4;
  error_code local_res48;
  bool is_done;
  size_t offset;
  type r;
  error_code *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff78;
  error_code *in_stack_ffffffffffffff80;
  byte local_71;
  error_code local_50;
  byte local_39;
  long local_38;
  basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *local_30;
  encoding_kind local_28;
  undefined8 *local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_20 = in_RCX;
  std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  tVar4 = unicode_traits::detect_json_encoding<char>
                    ((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = (basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *)
            tVar4.ptr;
  local_28 = tVar4.encoding;
  local_30 = this_00;
  if ((local_28 == utf8) || (local_28 == undetected)) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    local_38 = (long)this_00 - (long)pvVar2;
    this_01 = (basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x28);
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    this_02 = (error_code *)(pvVar2 + local_38);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    basic_json_parser<char,_std::allocator<char>_>::update
              (this_01,(char_type *)this_02,sVar3 - local_38);
    bVar1 = basic_json_parser<char,_std::allocator<char>_>::done
                      ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x28));
    local_71 = 1;
    if (!bVar1) {
      local_71 = *(byte *)(in_RDI + 0x180);
    }
    local_39 = local_71 & 1;
    if (local_39 == 0) {
      std::error_code::error_code((error_code *)this_00);
      read_next(this_00,in_stack_ffffffffffffff68);
      bVar1 = std::error_code::operator_cast_to_bool(&local_50);
      if (bVar1) {
        std::error_code::error_code<jsoncons::json_errc,void>
                  (this_02,(json_errc)((ulong)this_01 >> 0x20));
        bVar1 = std::operator==(this_02,(error_code *)this_01);
        if (bVar1) {
          *(undefined1 *)(in_RDI + 0x180) = 1;
        }
        else {
          *local_20 = local_50._0_8_;
          local_20[1] = local_50._M_cat;
        }
      }
    }
  }
  else {
    std::error_code::operator=
              (in_stack_ffffffffffffff80,(json_errc)(in_stack_ffffffffffffff78 >> 0x20));
  }
  return;
}

Assistant:

void initialize_with_string_view(string_view_type sv, std::error_code& ec)
    {
        auto r = unicode_traits::detect_json_encoding(sv.data(), sv.size());
        if (!(r.encoding == unicode_traits::encoding_kind::utf8 || r.encoding == unicode_traits::encoding_kind::undetected))
        {
            ec = json_errc::illegal_unicode_character;
            return;
        }
        std::size_t offset = (r.ptr - sv.data());
        parser_.update(sv.data()+offset,sv.size()-offset);
        bool is_done = parser_.done() || done_;
        if (!is_done)
        {
            std::error_code local_ec;
            read_next(local_ec);
            if (local_ec)
            {
                if (local_ec == json_errc::unexpected_eof)
                {
                    done_ = true;
                }
                else
                {
                    ec = local_ec;
                }
            }
        }
    }